

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O1

char * getobjname(Proto *p,int lastpc,int reg,char **name)

{
  ulong uVar1;
  long lVar2;
  uint uVar3;
  int iVar4;
  char *pcVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  bool bVar12;
  ravi_type_map type;
  TString *usertype;
  ravi_type_map local_3c;
  TString *local_38;
  
  pcVar5 = luaF_getlocalname(p,reg + 1,lastpc,&local_3c,&local_38);
  *name = pcVar5;
  if (pcVar5 != (char *)0x0) {
    return "local";
  }
  if (lastpc < 1) {
    iVar4 = -1;
  }
  else {
    uVar6 = 0;
    uVar7 = 0xffffffff;
    uVar8 = 0;
    do {
      uVar3 = p->code[uVar6];
      uVar9 = uVar3 >> 8 & 0x7f;
      uVar11 = uVar3 & 0xff;
      if (uVar11 < 0x24) {
        if (uVar11 == 4) {
          if (((int)uVar9 <= reg) && (reg <= (int)(uVar9 + (uVar3 >> 0x18)))) goto LAB_00116f40;
        }
        else {
          if (uVar11 != 0x1e) goto LAB_00116f2d;
          uVar1 = (uVar6 - 0x7fff) + (ulong)(uVar3 >> 0x10);
          iVar4 = (int)uVar1;
          uVar10 = uVar8;
          if ((int)uVar8 < iVar4) {
            uVar10 = uVar1 & 0xffffffff;
          }
          if ((long)iVar4 <= (long)uVar6) {
            uVar10 = uVar8;
          }
          if (iVar4 <= lastpc) {
            uVar8 = uVar10;
          }
        }
      }
      else {
        if (1 < uVar11 - 0x24) {
          if (uVar11 != 0x29) {
LAB_00116f2d:
            if ((uVar9 == reg) && ((luaP_opmodes[uVar3 & 0xff] & 0x40) != 0)) goto LAB_00116f40;
            goto LAB_00116f4b;
          }
          uVar9 = uVar9 + 2;
        }
        if ((int)uVar9 <= reg) {
LAB_00116f40:
          uVar7 = uVar6 & 0xffffffff;
          if ((long)uVar6 < (long)(int)uVar8) {
            uVar7 = 0xffffffff;
          }
        }
      }
LAB_00116f4b:
      iVar4 = (int)uVar7;
      uVar6 = uVar6 + 1;
    } while ((uint)lastpc != uVar6);
  }
  if (iVar4 == -1) {
    return (char *)0x0;
  }
  pcVar5 = (char *)p->code;
  uVar9 = *(uint *)((long)pcVar5 + (long)iVar4 * 4);
  uVar3 = (uVar9 & 0xff) - 0x4b;
  uVar8 = (ulong)uVar3;
  if (uVar3 < 0x29) {
    if ((0x12900000060U >> (uVar8 & 0x3f) & 1) != 0) goto switchD_00116fec_caseD_6;
    if ((0x1fUL >> (uVar8 & 0x3f) & 1) == 0) {
      if ((0x4400000000U >> (uVar8 & 0x3f) & 1) == 0) goto LAB_00116fd4;
      goto switchD_00116fec_caseD_c;
    }
switchD_00116fec_caseD_0:
    uVar3 = uVar9 >> 8 & 0x7f;
    pcVar5 = (char *)(ulong)uVar3;
    bVar12 = uVar3 <= uVar9 >> 0x18;
    if (!bVar12) {
      pcVar5 = getobjname(p,iVar4,uVar9 >> 0x18,name);
      goto LAB_001170fb;
    }
switchD_00116fec_caseD_3:
  }
  else {
LAB_00116fd4:
    bVar12 = true;
    switch(uVar9 & 0xff) {
    case 0:
      goto switchD_00116fec_caseD_0;
    case 1:
    case 2:
      if ((char)uVar9 == '\x01') {
        uVar9 = uVar9 >> 0x10;
      }
      else {
        uVar9 = *(uint *)((long)pcVar5 + ((long)iVar4 + 1) * 4) >> 8;
      }
      pcVar5 = "constant";
      if ((*(ushort *)((long)&p->k->tt_ + (ulong)(uVar9 << 4)) & 0xf) != 4) goto LAB_001170fb;
      lVar2 = *(long *)((long)&p->k->value_ + (ulong)(uVar9 << 4));
      if ((*(byte *)(lVar2 + 8) & 0xf) != 4) {
        __assert_fail("(((((&p->k[b])->value_).gc)->tt) & 0x0F) == 4",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldebug.c"
                      ,0x1f9,"const char *getobjname(Proto *, int, int, const char **)");
      }
      *name = (char *)(lVar2 + 0x18);
      break;
    default:
      goto switchD_00116fec_caseD_3;
    case 5:
      pcVar5 = upvalname(p,uVar9 >> 0x18);
      *name = pcVar5;
      pcVar5 = "upvalue";
      break;
    case 6:
    case 7:
switchD_00116fec_caseD_6:
      if (((char)uVar9 == '\x06') || ((uVar9 & 0xff) == 0x73)) {
        pcVar5 = upvalname(p,uVar9 >> 0x18);
      }
      else {
        pcVar5 = luaF_getlocalname(p,(uVar9 >> 0x18) + 1,iVar4,&local_3c,&local_38);
      }
      kname(p,iVar4,uVar9 >> 0x10 & 0xff,name);
      if (pcVar5 == (char *)0x0) {
        pcVar5 = "field";
      }
      else {
        iVar4 = strcmp(pcVar5,"_ENV");
        pcVar5 = "field";
        if (iVar4 == 0) {
          pcVar5 = "global";
        }
      }
      break;
    case 0xc:
switchD_00116fec_caseD_c:
      kname(p,iVar4,uVar9 >> 0x10 & 0xff,name);
      pcVar5 = "method";
    }
    bVar12 = false;
  }
LAB_001170fb:
  if (bVar12) {
    return (char *)0x0;
  }
  return (char *)(Instruction *)pcVar5;
}

Assistant:

static const char *getobjname (Proto *p, int lastpc, int reg,
                               const char **name) {
  int pc;
  ravi_type_map type;
  TString *usertype;
  *name = luaF_getlocalname(p, reg + 1, lastpc, &type, &usertype);
  if (*name)  /* is a local? */
    return "local";
  /* else try symbolic execution */
  pc = findsetreg(p, lastpc, reg);
  if (pc != -1) {  /* could find instruction? */
    Instruction i = p->code[pc];
    OpCode op = GET_OPCODE(i);
    switch (op) {
      case OP_RAVI_MOVEI:
      case OP_RAVI_MOVEF:
      case OP_RAVI_MOVEFARRAY:
      case OP_RAVI_MOVEIARRAY:
      case OP_RAVI_MOVETAB:
      case OP_MOVE: {
        int b = GETARG_B(i);  /* move from 'b' to 'a' */
        if (b < GETARG_A(i))
          return getobjname(p, pc, b, name);  /* get name for 'b' */
        break;
      }
      case OP_RAVI_GETI:
      case OP_RAVI_TABLE_GETFIELD:
      case OP_RAVI_GETFIELD:
      case OP_RAVI_IARRAY_GET:
      case OP_RAVI_FARRAY_GET:
      case OP_GETTABUP:
      case OP_RAVI_GETTABUP_SK:
      case OP_GETTABLE: {
        int k = GETARG_C(i);  /* key index */
        int t = GETARG_B(i);  /* table index */
        const char *vn = (op != OP_GETTABUP && op != OP_RAVI_GETTABUP_SK)  /* name of indexed variable */
                         ? luaF_getlocalname(p, t + 1, pc, &type, &usertype)  /* t+1 is the local variable number */
                         : upvalname(p, t);
        kname(p, pc, k, name);
        return (vn && strcmp(vn, LUA_ENV) == 0) ? "global" : "field";
      }
      case OP_GETUPVAL: {
        *name = upvalname(p, GETARG_B(i));
        return "upvalue";
      }
      case OP_LOADK:
      case OP_LOADKX: {
        int b = (op == OP_LOADK) ? GETARG_Bx(i)
                                 : GETARG_Ax(p->code[pc + 1]);
        if (ttisstring(&p->k[b])) {
          *name = svalue(&p->k[b]);
          return "constant";
        }
        break;
      }
      case OP_RAVI_SELF_SK:
      case OP_RAVI_TABLE_SELF_SK:
      case OP_SELF: {
        int k = GETARG_C(i);  /* key index */
        kname(p, pc, k, name);
        return "method";
      }
      default: break;  /* go through to return NULL */
    }
  }
  return NULL;  /* could not find reasonable name */
}